

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_3_2::maxEigenVector<Imath_3_2::Matrix44<float>,Imath_3_2::Vec4<float>>
               (Matrix44<float> *A,Vec4<float> *V)

{
  int iVar1;
  uint i;
  long lVar2;
  int iVar3;
  Vec4<float> S;
  Matrix44<float> MV;
  
  MV.x[0][0] = 1.0;
  MV.x[0][1] = 0.0;
  MV.x[0][2] = 0.0;
  MV.x[0][3] = 0.0;
  MV.x[1][0] = 0.0;
  MV.x[1][1] = 1.0;
  MV.x[1][2] = 0.0;
  MV.x[1][3] = 0.0;
  MV.x[2][0] = 0.0;
  MV.x[2][1] = 0.0;
  MV.x[2][2] = 1.0;
  MV.x[2][3] = 0.0;
  MV.x[3][0] = 0.0;
  MV.x[3][1] = 0.0;
  MV.x[3][2] = 0.0;
  MV.x[3][3] = 1.0;
  jacobiEigenSolver<float>(A,&S,&MV);
  iVar3 = 0;
  for (lVar2 = 1; lVar2 != 4; lVar2 = lVar2 + 1) {
    iVar1 = (int)lVar2;
    if (ABS(*(float *)((long)(MV.x + -1) + lVar2 * 4)) <=
        ABS(*(float *)((long)(MV.x + -1) + (long)iVar3 * 4))) {
      iVar1 = iVar3;
    }
    iVar3 = iVar1;
  }
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
    *(float *)((long)&V->x + lVar2) = MV.x[0][iVar3 + lVar2];
  }
  return;
}

Assistant:

void
maxEigenVector (TM& A, TV& V)
{
    TV S;
    TM MV;
    jacobiEigenSolver (A, S, MV);

    int maxIdx (0);
    for (unsigned int i = 1; i < TV::dimensions (); ++i)
    {
        if (std::abs (S[i]) > std::abs (S[maxIdx])) maxIdx = i;
    }

    for (unsigned int i = 0; i < TV::dimensions (); ++i)
        V[i] = MV[i][maxIdx];
}